

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blech32.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  bool local_d;
  _Bool tests_ok;
  
  _Var1 = check_confidential_addr_from_addr_segwit_pubkey();
  if (!_Var1) {
    printf("check_confidential_addr_from_addr_segwit(pubkey) test failed!\n");
  }
  local_d = _Var1;
  _Var1 = check_confidential_addr_from_addr_segwit_script();
  if (!_Var1) {
    printf("check_confidential_addr_from_addr_segwit(script) test failed!\n");
    local_d = false;
  }
  _Var1 = check_confidential_addr_to_addr_segwit_pubkey();
  if (!_Var1) {
    printf("check_confidential_addr_to_addr_segwit(pubkey) test failed!\n");
    local_d = false;
  }
  _Var1 = check_confidential_addr_to_addr_segwit_script();
  if (!_Var1) {
    printf("check_confidential_addr_to_addr_segwit(script) test failed!\n");
    local_d = false;
  }
  _Var1 = check_confidential_addr_segwit_to_ec_public_key_pubkey();
  if (!_Var1) {
    printf("check_confidential_addr_segwit_to_ec_public_key(pubkey) test failed!\n");
    local_d = false;
  }
  _Var1 = check_confidential_addr_segwit_to_ec_public_key_script();
  if (!_Var1) {
    printf("check_confidential_addr_segwit_to_ec_public_key(script) test failed!\n");
    local_d = false;
  }
  return (uint)!local_d;
}

Assistant:

int main(void)
{
    bool tests_ok = true;

    if (!check_confidential_addr_from_addr_segwit_pubkey()) {
        printf("check_confidential_addr_from_addr_segwit(pubkey) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_from_addr_segwit_script()) {
        printf("check_confidential_addr_from_addr_segwit(script) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_to_addr_segwit_pubkey()) {
        printf("check_confidential_addr_to_addr_segwit(pubkey) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_to_addr_segwit_script()) {
        printf("check_confidential_addr_to_addr_segwit(script) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_segwit_to_ec_public_key_pubkey()) {
        printf("check_confidential_addr_segwit_to_ec_public_key(pubkey) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_segwit_to_ec_public_key_script()) {
        printf("check_confidential_addr_segwit_to_ec_public_key(script) test failed!\n");
        tests_ok = false;
    }

    return tests_ok ? 0 : 1;
}